

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::readDataColumnWise(HinOut *this)

{
  reference pvVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  int i;
  ifstream f;
  size_type in_stack_fffffffffffffda8;
  size_type in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  int local_214;
  string local_210 [528];
  
  std::ifstream::ifstream(local_210);
  std::ifstream::open(local_210,(int)in_RDI + 0x7b0);
  std::istream::operator>>((istream *)local_210,(int *)in_RDI);
  std::istream::operator>>
            ((istream *)local_210,
             (int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + 4));
  std::istream::operator>>
            ((istream *)local_210,
             (int *)&in_RDI[0x51].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  for (local_214 = 0;
      local_214 <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + 1; local_214 = local_214 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar1);
  }
  for (local_214 = 0;
      local_214 <
      *(int *)&in_RDI[0x51].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_214 = local_214 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar1);
  }
  for (local_214 = 0;
      local_214 <
      *(int *)&in_RDI[0x51].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_214 = local_214 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 3,(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar2);
  }
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::vector<double,_std::allocator<double>_>::assign
            (in_RDI,in_stack_fffffffffffffda8,(value_type_conflict1 *)0x1ba7f7);
  std::vector<double,_std::allocator<double>_>::assign
            (in_RDI,in_stack_fffffffffffffda8,(value_type_conflict1 *)0x1ba821);
  std::vector<double,_std::allocator<double>_>::assign
            (in_RDI,in_stack_fffffffffffffda8,(value_type_conflict1 *)0x1ba841);
  for (local_214 = 0;
      local_214 <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start; local_214 = local_214 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 4,(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar2);
  }
  for (local_214 = 0;
      local_214 <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start; local_214 = local_214 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 5,(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar2);
  }
  for (local_214 = 0;
      local_214 <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start; local_214 = local_214 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 6,(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar2);
  }
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::vector<double,_std::allocator<double>_>::assign
            (in_RDI,in_stack_fffffffffffffda8,(value_type_conflict1 *)0x1ba978);
  std::vector<double,_std::allocator<double>_>::assign
            (in_RDI,in_stack_fffffffffffffda8,(value_type_conflict1 *)0x1ba999);
  for (local_214 = 0;
      local_214 <
      *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + 4); local_214 = local_214 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 7,(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar2);
  }
  for (local_214 = 0;
      local_214 <
      *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + 4); local_214 = local_214 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 8,(long)local_214);
    std::istream::operator>>((istream *)local_210,pvVar2);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void HinOut::readDataColumnWise() {
	ifstream f;
	int i;

	f.open (fileIn, ios::in );

	//counts
	f >> numCol ;
	f >> numRow ;
	f >> AcountX ;

	//matrix
	Astart.resize(numCol + 1);
	Aindex.resize(AcountX);
	Avalue.resize(AcountX);

	for (i=0; i<numCol +1; i++)
		f >> Astart[i];


	for (i=0; i<AcountX; i++)
		f >> Aindex[i];


	for (i=0; i<AcountX; i++)
		f >> Avalue[i];

	//f >> flush;

	//compareData(0);

	//cost and bounds
	colCost.reserve(numCol);
	colLower.reserve(numCol);
	colUpper.reserve(numCol);

	colCost.assign(numCol, 0);
	colLower.assign(numCol, -HSOL_CONST_INF);
	colUpper.assign(numCol, HSOL_CONST_INF);



	for (i=0; i<numCol; i++) {
		f >> colCost[i];
	}


	for (i=0; i<numCol; i++) {
		f >> colLower[i];
	}


	for (i=0; i<numCol; i++) {
		f >> colUpper[i];
	}

	//compareData(1);

	rowLower.reserve(numRow);
	rowUpper.reserve(numRow);
	rowLower.assign(numRow, -HSOL_CONST_INF);
    rowUpper.assign(numRow, HSOL_CONST_INF);

	for (i=0; i<numRow; i++) {
			f >> rowLower[i];
	}

	for (i=0; i<numRow; i++){
			f >> rowUpper[i];
	}

	f.close();

}